

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random.cpp
# Opt level: O3

uint32_t __thiscall pm::Random::integer(Random *this,uint32_t min,uint32_t max)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  
  uVar3 = max - min;
  if (min <= max) {
    uVar4 = this->state_;
    do {
      uVar5 = uVar4 * 0x5851f42d4c957f2d + this->increment_;
      uVar1 = (uint)(uVar4 >> 0x2d) ^ (uint)(uVar4 >> 0x1b);
      bVar2 = (byte)(uVar4 >> 0x3b);
      uVar1 = uVar1 >> bVar2 | uVar1 << 0x20 - bVar2;
      uVar4 = uVar5;
    } while (uVar1 < -uVar3 % uVar3);
    this->state_ = uVar5;
    return min + uVar1 % uVar3;
  }
  __assert_fail("min <= max",
                "/workspace/llm4binary/github/license_all_cmakelists_25/encelo[P]pmTracer/src/Random.cpp"
                ,0x3d,"uint32_t pm::Random::integer(uint32_t, uint32_t)");
}

Assistant:

uint32_t Random::integer(uint32_t min, uint32_t max)
{
	assert(min <= max);
	return min + boundRandom(state_, increment_, max - min);
}